

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v5::vprint(FILE *f,wstring_view format_str,wformat_args args)

{
  wmemory_buffer buffer;
  
  buffer.super_basic_buffer<wchar_t>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<wchar_t>.size_ = 0;
  buffer.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_00165038;
  buffer.super_basic_buffer<wchar_t>.capacity_ = 500;
  internal::vformat_to<wchar_t>(&buffer,format_str.data_,format_str.size_);
  fwrite(buffer.super_basic_buffer<wchar_t>.ptr_,4,buffer.super_basic_buffer<wchar_t>.size_,
         (FILE *)f);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(&buffer);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  internal::vformat_to(buffer, format_str, args);
  std::fwrite(buffer.data(), sizeof(wchar_t), buffer.size(), f);
}